

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitPropLoad
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo,
          bool skipUseBeforeDeclarationCheck)

{
  code *pcVar1;
  RegSlot R0;
  bool bVar2;
  bool bVar3;
  ProfileId profileId_00;
  OpCode op_00;
  ScopeType SVar4;
  DynamicLoadKind DVar5;
  PropertyId PVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint uVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  ByteCodeLabel labelID;
  int iVar12;
  undefined4 *puVar13;
  FuncInfo *pFVar14;
  ByteCodeWriter *this_00;
  Scope *this_01;
  ParseNode *pPVar15;
  ParseNodeVar *pPVar16;
  Type *pTVar17;
  int iVar18;
  PropertyId local_248;
  int local_15c;
  PropertyId local_10c;
  Scope *local_f0;
  PropertyId propertyId_2;
  RegSlot instLocation;
  uint cacheId_3;
  int i;
  ByteCodeLabel doneLabel;
  OpCode op;
  bool chkBlockVar;
  ProfileId profileId;
  PropertyId slot_1;
  OpCode opcode;
  uint cacheId_2;
  uint cacheId_1;
  uint cacheId;
  PropertyId propertyId_1;
  PropertyId slot;
  uint32 frameDisplayIndex_1;
  uint32 frameDisplayIndex;
  PropertyIdIndexType propertyIndex;
  PropertyId propertyId;
  DynamicLoadRecord rec;
  undefined1 local_80 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  Scope *symScope;
  Scope *scope;
  DynamicLoadKind local_38;
  PropertyId envIndex;
  RegSlot scopeLocation;
  bool skipUseBeforeDeclarationCheck_local;
  FuncInfo *funcInfo_local;
  IdentPtr pid_local;
  Symbol *sym_local;
  ByteCodeGenerator *pBStack_10;
  RegSlot lhsLocation_local;
  ByteCodeGenerator *this_local;
  
  local_38 = ~Invalid;
  scope._4_4_ = -1;
  symScope = (Scope *)0x0;
  envIndex._3_1_ = skipUseBeforeDeclarationCheck;
  _scopeLocation = funcInfo;
  funcInfo_local = (FuncInfo *)pid;
  pid_local = (IdentPtr)sym;
  sym_local._4_4_ = lhsLocation;
  pBStack_10 = this;
  if (sym == (Symbol *)0x0) {
    local_f0 = this->globalScope;
  }
  else {
    local_f0 = Symbol::GetScope(sym);
  }
  recList._40_8_ = local_f0;
  if (local_f0 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x13b4,"(symScope)","symScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  if ((pid_local == (IdentPtr)0x0) ||
     (bVar2 = Symbol::GetIsModuleExportStorage((Symbol *)pid_local), !bVar2)) {
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)local_80,this->alloc,4);
    while ((symScope = FindScopeForSym(this,(Scope *)recList._40_8_,symScope,
                                       (PropertyId *)((long)&scope + 4),_scopeLocation),
           symScope != this->globalScope &&
           (local_38 = Scope::GetLocation(symScope), symScope != (Scope *)recList._40_8_))) {
      if ((symScope == (Scope *)0x0) || (bVar2 = Scope::GetIsDynamic(symScope), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x13ce,"(scope && scope->GetIsDynamic())",
                           "scope && scope->GetIsDynamic()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      bVar2 = Scope::GetIsObject(symScope);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x13cf,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)&propertyIndex);
      propertyId = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
      if (pid_local == (IdentPtr)0x0) {
        local_10c = Ident::GetPropertyId((Ident *)funcInfo_local);
      }
      else {
        local_10c = Symbol::EnsurePosition((Symbol *)pid_local,this);
      }
      uVar9 = FuncInfo::FindOrAddReferencedPropertyId(_scopeLocation,local_10c);
      SVar4 = Scope::GetScopeType(symScope);
      iVar12 = scope._4_4_;
      if (SVar4 == ScopeType_With) {
        if (scope._4_4_ == -1) {
          Js::ByteCodeWriter::BrProperty(&this->m_writer,BrOnHasProperty,propertyId,local_38,uVar9);
          propertyIndex = 3;
          rec.kind = local_38;
        }
        else {
          uVar7 = Js::FrameDisplay::GetOffsetOfScopes();
          DVar5 = iVar12 + (uVar7 >> 3);
          Js::ByteCodeWriter::BrEnvProperty
                    (&this->m_writer,BrOnHasEnvProperty,propertyId,uVar9,DVar5);
          propertyIndex = 4;
          rec.kind = DVar5;
        }
      }
      else if (scope._4_4_ == -1) {
        Js::ByteCodeWriter::BrLocalProperty(&this->m_writer,BrOnHasLocalProperty,propertyId,uVar9);
        propertyIndex = 1;
        rec.kind = local_38;
      }
      else {
        uVar7 = Js::FrameDisplay::GetOffsetOfScopes();
        DVar5 = iVar12 + (uVar7 >> 3);
        Js::ByteCodeWriter::BrEnvProperty
                  (&this->m_writer,BrOnHasLocalEnvProperty,propertyId,uVar9,DVar5);
        propertyIndex = 2;
        rec.kind = DVar5;
      }
      JsUtil::
      List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)local_80,(DynamicLoadRecord *)&propertyIndex);
    }
    if ((pid_local == (IdentPtr)0x0) ||
       (((bVar2 = Symbol::GetNeedDeclaration((Symbol *)pid_local), !bVar2 ||
         (pFVar14 = Scope::GetFunc(symScope), pFVar14 != _scopeLocation)) ||
        ((envIndex._3_1_ & 1) != 0)))) {
      if ((pid_local == (IdentPtr)0x0) || (bVar2 = Symbol::GetIsGlobal((Symbol *)pid_local), bVar2))
      {
        if (pid_local == (IdentPtr)0x0) {
          local_15c = Ident::GetPropertyId((Ident *)funcInfo_local);
        }
        else {
          local_15c = Symbol::EnsurePosition((Symbol *)pid_local,this);
        }
        pFVar14 = _scopeLocation;
        if ((this->flags & 0x400) == 0) {
          if ((this->flags & 4) == 0) {
            profileId = 0x6a;
            if (local_15c == 0xba) {
              profileId = 0xaa;
            }
            else if (local_15c == 0x105) {
              profileId = 0xa9;
            }
            else if (local_15c == 0x186) {
              profileId = 0xa8;
            }
            else if ((local_15c == 0x27a) &&
                    (((DAT_01ea4155 & 1) != 0 || ((DAT_01ea4156 & 1) != 0)))) {
              profileId = 0x158;
            }
            if (profileId == 0x6a) {
              EmitPatchableRootProperty
                        (this,LdRootFld,sym_local._4_4_,local_15c,false,false,_scopeLocation);
            }
            else {
              this_00 = Writer(this);
              Js::ByteCodeWriter::Reg1(this_00,profileId,sym_local._4_4_);
            }
          }
          else {
            RVar11 = FuncInfo::GetEnvRegister(_scopeLocation);
            uVar9 = FuncInfo::FindOrAddInlineCacheId(pFVar14,RVar11,local_15c,false,false);
            Js::ByteCodeWriter::ElementP
                      (&this->m_writer,ScopedLdFld,sym_local._4_4_,uVar9,false,true);
          }
        }
        else {
          bVar2 = Js::ParseableFunctionInfo::GetIsStrictMode(_scopeLocation->byteCodeFunction);
          if ((bVar2) && (bVar2 = FuncInfo::IsGlobalFunction(_scopeLocation), bVar2)) {
            uVar9 = FuncInfo::FindOrAddInlineCacheId
                              (_scopeLocation,_scopeLocation->frameDisplayRegister,local_15c,false,
                               false);
            Js::ByteCodeWriter::ElementP
                      (&this->m_writer,ScopedLdFld,sym_local._4_4_,uVar9,false,true);
          }
          else {
            pFVar14 = _scopeLocation;
            RVar11 = FuncInfo::GetEnvRegister(_scopeLocation);
            uVar9 = FuncInfo::FindOrAddInlineCacheId(pFVar14,RVar11,local_15c,false,false);
            Js::ByteCodeWriter::ElementP
                      (&this->m_writer,ScopedLdFld,sym_local._4_4_,uVar9,false,true);
          }
        }
      }
      else {
        bVar2 = Symbol::IsInSlot((Symbol *)pid_local,this,_scopeLocation,false);
        RVar11 = sym_local._4_4_;
        if ((bVar2) || (scope._4_4_ != -1)) {
          PVar6 = Symbol::EnsureScopeSlot((Symbol *)pid_local,this,_scopeLocation);
          profileId_00 = FuncInfo::FindOrAddSlotProfileId(_scopeLocation,symScope,PVar6);
          bVar2 = NeedCheckBlockVar(this,(Symbol *)pid_local,symScope,_scopeLocation);
          op_00 = GetLdSlotOp(this,symScope,scope._4_4_,local_38,_scopeLocation);
          this_01 = Symbol::GetScope((Symbol *)pid_local);
          bVar3 = Scope::GetIsObject(this_01);
          RVar11 = sym_local._4_4_;
          iVar12 = scope._4_4_;
          iVar18 = 2;
          if (bVar3) {
            iVar18 = 0;
          }
          uVar7 = PVar6 + iVar18;
          if (scope._4_4_ == -1) {
            if ((local_38 == ~Invalid) ||
               ((local_38 != _scopeLocation->frameSlotsRegister &&
                (local_38 != _scopeLocation->frameObjRegister)))) {
              bVar3 = Scope::HasInnerScopeIndex(symScope);
              RVar11 = sym_local._4_4_;
              if (bVar3) {
                uVar9 = Scope::GetInnerScopeIndex(symScope);
                Js::ByteCodeWriter::SlotI2(&this->m_writer,op_00,RVar11,uVar9,uVar7,profileId_00);
              }
              else {
                bVar3 = Scope::GetIsObject(symScope);
                if (!bVar3) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar13 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                     ,0x146d,"(scope->GetIsObject())","scope->GetIsObject()");
                  if (!bVar3) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar13 = 0;
                }
                Js::ByteCodeWriter::Slot
                          (&this->m_writer,op_00,sym_local._4_4_,local_38,uVar7,profileId_00);
              }
            }
            else {
              Js::ByteCodeWriter::SlotI1(&this->m_writer,op_00,sym_local._4_4_,uVar7,profileId_00);
            }
          }
          else {
            uVar8 = Js::FrameDisplay::GetOffsetOfScopes();
            Js::ByteCodeWriter::SlotI2
                      (&this->m_writer,op_00,RVar11,iVar12 + (uVar8 >> 3),uVar7,profileId_00);
          }
          if (bVar2) {
            Js::ByteCodeWriter::Reg1(&this->m_writer,ChkUndecl,sym_local._4_4_);
          }
        }
        else {
          RVar10 = Symbol::GetLocation((Symbol *)pid_local);
          R0 = sym_local._4_4_;
          if (RVar11 != RVar10) {
            RVar11 = Symbol::GetLocation((Symbol *)pid_local);
            Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,R0,RVar11);
          }
          bVar2 = Symbol::GetIsBlockVar((Symbol *)pid_local);
          if ((bVar2) &&
             ((pPVar15 = Symbol::GetDecl((Symbol *)pid_local), pPVar15->nop == knopLetDecl ||
              (pPVar15 = Symbol::GetDecl((Symbol *)pid_local), pPVar15->nop == knopConstDecl)))) {
            pPVar15 = Symbol::GetDecl((Symbol *)pid_local);
            pPVar16 = ParseNode::AsParseNodeVar(pPVar15);
            if (pPVar16->isSwitchStmtDecl != '\0') {
              Js::ByteCodeWriter::Reg1(&this->m_writer,ChkUndecl,sym_local._4_4_);
            }
          }
        }
      }
    }
    else {
      bVar2 = Symbol::IsInSlot((Symbol *)pid_local,this,_scopeLocation,false);
      if (bVar2) {
        PVar6 = Symbol::EnsureScopeSlot((Symbol *)pid_local,this,_scopeLocation);
        FuncInfo::FindOrAddSlotProfileId(_scopeLocation,symScope,PVar6);
      }
      if ((envIndex._3_1_ & 1) == 0) {
        EmitUseBeforeDeclarationRuntimeError(this,sym_local._4_4_);
      }
      else if (sym_local._4_4_ != 0xffffffff) {
        Js::ByteCodeWriter::Reg1(&this->m_writer,InitUndecl,sym_local._4_4_);
      }
    }
    bVar2 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::Empty
                      ((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                       local_80);
    if (!bVar2) {
      labelID = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
      Js::ByteCodeWriter::Br(&this->m_writer,labelID);
      instLocation = 0;
      while( true ) {
        if (pid_local == (IdentPtr)0x0) {
          local_248 = Ident::GetPropertyId((Ident *)funcInfo_local);
        }
        else {
          local_248 = Symbol::EnsurePosition((Symbol *)pid_local,this);
        }
        pTVar17 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_80,instLocation);
        Js::ByteCodeWriter::MarkLabel(&this->m_writer,pTVar17->label);
        pTVar17 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_80,instLocation);
        pFVar14 = _scopeLocation;
        switch(pTVar17->kind) {
        case Local:
          pTVar17 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,instLocation);
          uVar9 = FuncInfo::FindOrAddInlineCacheId
                            (pFVar14,(pTVar17->field_2).instance,local_248,false,false);
          Js::ByteCodeWriter::ElementP
                    (&this->m_writer,LdLocalFld_ReuseLoc,sym_local._4_4_,uVar9,false,true);
          break;
        case Env:
          RVar11 = FuncInfo::AcquireTmpRegister(_scopeLocation);
          pTVar17 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,instLocation);
          Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar11,(pTVar17->field_2).index);
          uVar9 = FuncInfo::FindOrAddInlineCacheId(_scopeLocation,RVar11,local_248,false,false);
          Js::ByteCodeWriter::PatchableProperty
                    (&this->m_writer,LdFld_ReuseLoc,sym_local._4_4_,RVar11,uVar9,false,true);
          FuncInfo::ReleaseTmpRegister(_scopeLocation,RVar11);
          break;
        case LocalWith:
          RVar11 = FuncInfo::AcquireTmpRegister(_scopeLocation);
          pTVar17 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,instLocation);
          Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj,RVar11,(pTVar17->field_2).instance)
          ;
          uVar9 = FuncInfo::FindOrAddInlineCacheId(_scopeLocation,RVar11,local_248,false,false);
          Js::ByteCodeWriter::PatchableProperty
                    (&this->m_writer,LdFld_ReuseLoc,sym_local._4_4_,RVar11,uVar9,false,true);
          FuncInfo::ReleaseTmpRegister(_scopeLocation,RVar11);
          break;
        case EnvWith:
          RVar11 = FuncInfo::AcquireTmpRegister(_scopeLocation);
          pTVar17 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,instLocation);
          Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar11,(pTVar17->field_2).index);
          Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj,RVar11,RVar11);
          uVar9 = FuncInfo::FindOrAddInlineCacheId(_scopeLocation,RVar11,local_248,false,false);
          Js::ByteCodeWriter::PatchableProperty
                    (&this->m_writer,LdFld_ReuseLoc,sym_local._4_4_,RVar11,uVar9,false,true);
          FuncInfo::ReleaseTmpRegister(_scopeLocation,RVar11);
          break;
        default:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x14af,"((0))","(0)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        iVar12 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::
                 Count((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                       local_80);
        if (instLocation == iVar12 - 1U) break;
        Js::ByteCodeWriter::Br(&this->m_writer,labelID);
        instLocation = instLocation + 1;
      }
      Js::ByteCodeWriter::MarkLabel(&this->m_writer,labelID);
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)local_80);
  }
  else {
    EmitModuleExportAccess(this,(Symbol *)pid_local,LdModuleSlot,sym_local._4_4_,_scopeLocation);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitPropLoad(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo, bool skipUseBeforeDeclarationCheck)
{
    // If sym belongs to a parent frame, get it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just copy the value to the lhsLocation.

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym && sym->GetIsModuleExportStorage())
    {
        EmitModuleExportAccess(sym, Js::OpCode::LdModuleSlot, lhsLocation, funcInfo);
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }

        scopeLocation = scope->GetLocation();

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo && !skipUseBeforeDeclarationCheck)
    {
        // Ensure this symbol has a slot if it needs one.
        if (sym->IsInSlot(this, funcInfo))
        {
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            funcInfo->FindOrAddSlotProfileId(scope, slot);
        }

        if (skipUseBeforeDeclarationCheck)
        {
            if (lhsLocation != Js::Constants::NoRegister)
            {
                this->m_writer.Reg1(Js::OpCode::InitUndecl, lhsLocation);
            }
        }
        else
        {
            EmitUseBeforeDeclarationRuntimeError(this, lhsLocation);
        }
    }
    else if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->frameDisplayRegister, propertyId, false, false);
                this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
            }
            else
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, false);

                // Load of a symbol with unknown scope from within eval
                // Get it from the closure environment.
                this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, false);

            // Load of a symbol with unknown scope from within event handler.
            // Get it from the closure environment.
            this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
        }
        else
        {
            // Special case non-writable built-ins
            // TODO: support non-writable global property in general by detecting what attribute the property have current?
            // But can't be done if we are byte code serialized, because the attribute might be different for use fields
            // next time we run. May want to catch that in the JIT.
            Js::OpCode opcode = Js::OpCode::LdRootFld;

            // These properties are non-writable
            switch (propertyId)
            {
            case Js::PropertyIds::NaN:
                opcode = Js::OpCode::LdNaN;
                break;
            case Js::PropertyIds::Infinity:
                opcode = Js::OpCode::LdInfinity;
                break;
            case Js::PropertyIds::undefined:
                opcode = Js::OpCode::LdUndef;
                break;
            case Js::PropertyIds::__chakraLibrary:
                if (CONFIG_FLAG(LdChakraLib) || CONFIG_FLAG(TestChakraLib))
                {
                    opcode = Js::OpCode::LdChakraLib;
                }
                break;
            }

            if (opcode == Js::OpCode::LdRootFld)
            {
                this->EmitPatchableRootProperty(Js::OpCode::LdRootFld, lhsLocation, propertyId, false, false, funcInfo);
            }
            else
            {
                this->Writer()->Reg1(opcode, lhsLocation);
            }
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        Js::ProfileId profileId = funcInfo->FindOrAddSlotProfileId(scope, slot);
        bool chkBlockVar = NeedCheckBlockVar(sym, scope, funcInfo);
        Js::OpCode op;

        // Now get the property from its slot.
        op = this->GetLdSlotOp(scope, envIndex, scopeLocation, funcInfo);
        slot = slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, lhsLocation, envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var), slot, profileId);
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, lhsLocation, slot, profileId);
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.SlotI2(op, lhsLocation, scope->GetInnerScopeIndex(), slot, profileId);
        }
        else
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.Slot(op, lhsLocation, scopeLocation, slot, profileId);
        }

        if (chkBlockVar)
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }
    else
    {
        if (lhsLocation != sym->GetLocation())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, lhsLocation, sym->GetLocation());
        }
        if (sym->GetIsBlockVar() && ((sym->GetDecl()->nop == knopLetDecl || sym->GetDecl()->nop == knopConstDecl) && sym->GetDecl()->AsParseNodeVar()->isSwitchStmtDecl))
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            uint cacheId;
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    cacheId = funcInfo->FindOrAddInlineCacheId(recList.Item(i).instance, propertyId, false, false);
                    this->m_writer.ElementP(Js::OpCode::LdLocalFld_ReuseLoc, lhsLocation, cacheId);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }

}